

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_hermite(HairSetNode *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vec3fx *pVVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  Vec3fx *pVVar8;
  pointer pHVar9;
  uint uVar10;
  ulong uVar11;
  pointer pvVar12;
  ulong uVar13;
  ulong uVar14;
  Hair HVar15;
  ulong uVar16;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  local_70;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::resize(&this->tangents,
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    pvVar12 = (this->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar12) {
      uVar14 = 0;
      do {
        bezier_to_hermite_helper(&local_70,&this->hairs,pvVar12 + uVar14);
        sVar5 = local_70.first.size_active;
        pvVar12 = (this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = pvVar12[uVar14].size_alloced;
        uVar16 = uVar11;
        if ((uVar11 < local_70.first.size_active) &&
           (uVar16 = local_70.first.size_active, uVar13 = uVar11, uVar11 != 0)) {
          do {
            uVar16 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
            uVar13 = uVar16;
          } while (uVar16 < local_70.first.size_active);
        }
        if (local_70.first.size_active < pvVar12[uVar14].size_active) {
          pvVar12[uVar14].size_active = local_70.first.size_active;
        }
        if (uVar11 == uVar16) {
          pvVar12[uVar14].size_active = local_70.first.size_active;
        }
        else {
          pVVar3 = pvVar12[uVar14].items;
          pVVar8 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar12[uVar14].items = pVVar8;
          if (pvVar12[uVar14].size_active != 0) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar7);
              uVar4 = puVar2[1];
              puVar1 = (undefined8 *)((long)&(pvVar12[uVar14].items)->field_0 + lVar7);
              *puVar1 = *puVar2;
              puVar1[1] = uVar4;
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 0x10;
            } while (uVar11 < pvVar12[uVar14].size_active);
          }
          alignedFree(pVVar3);
          pvVar12[uVar14].size_active = sVar5;
          pvVar12[uVar14].size_alloced = uVar16;
        }
        sVar6 = local_70.second.size_active;
        if (sVar5 != 0) {
          lVar7 = 0;
          uVar11 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(local_70.first.items)->field_0 + lVar7);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)&(pvVar12[uVar14].items)->field_0 + lVar7);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            uVar11 = uVar11 + 1;
            lVar7 = lVar7 + 0x10;
          } while (uVar11 < pvVar12[uVar14].size_active);
        }
        pvVar12 = (this->tangents).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = pvVar12[uVar14].size_alloced;
        uVar16 = uVar11;
        if ((uVar11 < local_70.second.size_active) &&
           (uVar16 = local_70.second.size_active, uVar13 = uVar11, uVar11 != 0)) {
          do {
            uVar16 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
            uVar13 = uVar16;
          } while (uVar16 < local_70.second.size_active);
        }
        if (local_70.second.size_active < pvVar12[uVar14].size_active) {
          pvVar12[uVar14].size_active = local_70.second.size_active;
        }
        if (uVar11 == uVar16) {
          pvVar12[uVar14].size_active = local_70.second.size_active;
        }
        else {
          pVVar3 = pvVar12[uVar14].items;
          pVVar8 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar12[uVar14].items = pVVar8;
          if (pvVar12[uVar14].size_active != 0) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar7);
              uVar4 = puVar2[1];
              puVar1 = (undefined8 *)((long)&(pvVar12[uVar14].items)->field_0 + lVar7);
              *puVar1 = *puVar2;
              puVar1[1] = uVar4;
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 0x10;
            } while (uVar11 < pvVar12[uVar14].size_active);
          }
          alignedFree(pVVar3);
          pvVar12[uVar14].size_active = sVar6;
          pvVar12[uVar14].size_alloced = uVar16;
        }
        if (sVar6 != 0) {
          lVar7 = 0;
          uVar11 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(local_70.second.items)->field_0 + lVar7);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)&(pvVar12[uVar14].items)->field_0 + lVar7);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            uVar11 = uVar11 + 1;
            lVar7 = lVar7 + 0x10;
          } while (uVar11 < pvVar12[uVar14].size_active);
        }
        alignedFree(local_70.second.items);
        local_70.second.size_active = 0;
        local_70.second.size_alloced = 0;
        local_70.second.items = (Vec3fx *)0x0;
        alignedFree(local_70.first.items);
        uVar14 = uVar14 + 1;
        pvVar12 = (this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(this->positions).
                                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >>
                               5));
    }
    pHVar9 = (this->hairs).
             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->hairs).
        super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar9) {
      uVar10 = 0;
      uVar14 = 0;
      do {
        HVar15.id = 0;
        HVar15.vertex = uVar10;
        pHVar9[uVar14] = HVar15;
        uVar14 = uVar14 + 1;
        pHVar9 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = uVar10 + 2;
      } while (uVar14 < (ulong)((long)(this->hairs).
                                      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar9 >> 3
                               ));
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_hermite()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    tangents.resize(numTimeSteps());
    for (size_t i=0; i<positions.size(); i++) {
      auto pt = bezier_to_hermite_helper(hairs,positions[i]);
      positions[i] = pt.first;
      tangents[i] = pt.second;
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(2*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }